

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Aggregate_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Aggregate_State_PDU *this)

{
  pointer pAVar1;
  pointer pEVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pKVar5;
  ostream *poVar6;
  ostream *poVar7;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  ulong uVar8;
  pointer pKVar9;
  char cVar10;
  pointer pEVar11;
  pointer pSVar12;
  pointer pSVar13;
  pointer pAVar14;
  KString local_4a0;
  KString local_480;
  KString local_460;
  KString local_440;
  KString local_420;
  KString local_400;
  KString local_3e0;
  KString local_3c0;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  undefined1 local_340 [392];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar6 = std::operator<<(local_1a8,(string *)&local_360);
  poVar6 = std::operator<<(poVar6,"-Aggregate State PDU-\n");
  poVar7 = std::operator<<(poVar6,"Aggregate ID:\n");
  DATA_TYPE::AggregateIdentifier::GetAsString_abi_cxx11_(&local_4a0,&this->m_AggregateID);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar6 = (ostream *)(local_340 + 0x10);
  std::operator<<(poVar6,'\t');
  uVar8 = 0;
  while( true ) {
    uVar8 = uVar8 & 0xffff;
    if (local_4a0._M_string_length <= uVar8) break;
    cVar10 = local_4a0._M_dataplus._M_p[uVar8];
    if (local_4a0._M_string_length - 1 != uVar8 && cVar10 == '\n') {
      cVar10 = '\t';
      std::operator<<(poVar6,'\n');
    }
    std::operator<<(poVar6,cVar10);
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  poVar6 = std::operator<<(poVar7,local_380);
  poVar6 = std::operator<<(poVar6,"Force ID:                    ");
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar6 = std::operator<<(poVar6,(string *)local_340);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"Aggregate State:             ");
  DATA_TYPE::ENUMS::GetEnumAsStringAggregateState_abi_cxx11_
            (&local_3a0,(ENUMS *)(ulong)this->m_ui8AggState,Value_00);
  poVar6 = std::operator<<(poVar6,(string *)&local_3a0);
  poVar6 = std::operator<<(poVar6,"\n");
  DATA_TYPE::AggregateType::GetAsString_abi_cxx11_(&local_3c0,&this->m_AggregateType);
  poVar6 = std::operator<<(poVar6,(string *)&local_3c0);
  poVar6 = std::operator<<(poVar6,"Formation:                   ");
  DATA_TYPE::ENUMS::GetEnumAsStringFormation_abi_cxx11_
            (&local_3e0,(ENUMS *)(ulong)this->m_ui32Formation,Value_01);
  poVar6 = std::operator<<(poVar6,(string *)&local_3e0);
  poVar6 = std::operator<<(poVar6,"\n");
  DATA_TYPE::AggregateMarking::GetAsString_abi_cxx11_(&local_400,&this->m_AggregateMarking);
  poVar6 = std::operator<<(poVar6,(string *)&local_400);
  poVar6 = std::operator<<(poVar6,"Dimensions:                  ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_420,&this->m_Dimensions);
  poVar6 = std::operator<<(poVar6,(string *)&local_420);
  poVar6 = std::operator<<(poVar6,"Orientation:                 ");
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_440,&this->m_Ori);
  poVar6 = std::operator<<(poVar6,(string *)&local_440);
  poVar6 = std::operator<<(poVar6,"Center Of Mass:              ");
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_460,&this->m_CtrOfMassLoc);
  poVar6 = std::operator<<(poVar6,(string *)&local_460);
  poVar6 = std::operator<<(poVar6,"Velocity:                    ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_480,&this->m_Vel);
  poVar6 = std::operator<<(poVar6,(string *)&local_480);
  poVar6 = std::operator<<(poVar6,"Number Of Aggregates:        ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_ui16NumAggregates);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"Number Of Entities:          ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_ui16NumEntities);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"Number Of Silent Aggregates: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_ui16NumSilentAggregateTypes);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"Number Of Silent Entities    ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_ui16NumSilentEntityTypes);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)&local_480);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::__cxx11::string::~string((string *)&local_360);
  pAVar1 = (this->m_vAI).
           super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar14 = (this->m_vAI).
                 super__Vector_base<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
                 ._M_impl.super__Vector_impl_data._M_start; pAVar14 != pAVar1; pAVar14 = pAVar14 + 1
      ) {
    (*(pAVar14->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[2])
              ((string *)local_340,pAVar14);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  pEVar2 = (this->m_vEI).
           super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar11 = (this->m_vEI).
                 super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
                 ._M_impl.super__Vector_impl_data._M_start; pEVar11 != pEVar2; pEVar11 = pEVar11 + 1
      ) {
    (*(pEVar11->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[2])
              ((string *)local_340,pEVar11);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  if (this->m_ui16NumberOfPaddingOctets != 0) {
    poVar6 = std::operator<<(local_1a8,"Padding:                 ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->m_ui16NumberOfPaddingOctets);
    std::operator<<(poVar6," octets\n");
  }
  pSVar3 = (this->m_vSASL).
           super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar12 = (this->m_vSASL).
                 super__Vector_base<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar12 != pSVar3; pSVar12 = pSVar12 + 1
      ) {
    (*(pSVar12->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340,pSVar12);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  pSVar4 = (this->m_vSESL).
           super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pSVar13 = (this->m_vSESL).
                 super__Vector_base<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar13 != pSVar4; pSVar13 = pSVar13 + 1
      ) {
    (*(pSVar13->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340,pSVar13);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  poVar6 = std::operator<<(local_1a8,"Number Of Variable Datums:   ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  pKVar5 = (this->m_vVD).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar9 = (this->m_vVD).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar9 != pKVar5; pKVar9 = pKVar9 + 1) {
    (*(pKVar9->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Aggregate_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Aggregate State PDU-\n"
       << "Aggregate ID:\n"
       << IndentString( m_AggregateID.GetAsString(), 1 )
       << "Force ID:                    " << GetEnumAsStringForceID( m_ui8ForceID )         << "\n"
       << "Aggregate State:             " << GetEnumAsStringAggregateState( m_ui8AggState ) << "\n"
       << m_AggregateType.GetAsString()
       << "Formation:                   " << GetEnumAsStringFormation( m_ui32Formation )    << "\n"
       << m_AggregateMarking.GetAsString()
       << "Dimensions:                  " << m_Dimensions.GetAsString()
       << "Orientation:                 " << m_Ori.GetAsString()
       << "Center Of Mass:              " << m_CtrOfMassLoc.GetAsString()
       << "Velocity:                    " << m_Vel.GetAsString()
       << "Number Of Aggregates:        " << m_ui16NumAggregates                            << "\n"
       << "Number Of Entities:          " << m_ui16NumEntities                              << "\n"
       << "Number Of Silent Aggregates: " << m_ui16NumSilentAggregateTypes                  << "\n"
       << "Number Of Silent Entities    " << m_ui16NumSilentEntityTypes                     << "\n";

    vector<AggregateIdentifier>::const_iterator citrAI = m_vAI.begin();
    vector<AggregateIdentifier>::const_iterator citrAIEnd = m_vAI.end();
    for( ; citrAI != citrAIEnd; ++citrAI )
    {
        ss << citrAI->GetAsString();
    }

    vector<EntityIdentifier>::const_iterator citrEI = m_vEI.begin();
    vector<EntityIdentifier>::const_iterator citrEIEnd = m_vEI.end();
    for( ; citrEI != citrEIEnd; ++citrEI )
    {
        ss << citrEI->GetAsString();
    }

    if (needsPadding())
    {
        ss << "Padding:                 " << m_ui16NumberOfPaddingOctets << " octets\n";
    }

    vector<SilentAggregateSystem>::const_iterator citrSAS = m_vSASL.begin();
    vector<SilentAggregateSystem>::const_iterator citrSASEnd = m_vSASL.end();
    for( ; citrSAS != citrSASEnd; ++citrSAS )
    {
        ss << citrSAS->GetAsString();
    }

    vector<SilentEntitySystem>::const_iterator citrSES = m_vSESL.begin();
    vector<SilentEntitySystem>::const_iterator citrSESEnd = m_vSESL.end();
    for( ; citrSES != citrSESEnd; ++citrSES )
    {
        ss << citrSES->GetAsString();
    }

    ss << "Number Of Variable Datums:   " << m_ui32NumVariableDatum << "\n";

    vector<VarDtmPtr>::const_iterator citrVD = m_vVD.begin();
    vector<VarDtmPtr>::const_iterator citrVDEnd = m_vVD.end();
    for( ; citrVD != citrVDEnd; ++citrVD )
    {
        ss << ( *citrVD )->GetAsString();
    }

    return ss.str();
}